

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O3

int xmlBufGrow(xmlBufPtr buf,int len)

{
  xmlBufferAllocationScheme xVar1;
  uint uVar2;
  ulong uVar3;
  xmlChar *pxVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  char *extra;
  long lVar8;
  ulong uVar9;
  
  uVar7 = 0xffffffff;
  if (len < 0 || buf == (xmlBufPtr)0x0) goto LAB_0013654a;
  if (len == 0) {
    uVar7 = 0;
    goto LAB_0013654a;
  }
  if (buf->error != 0) goto LAB_0013654a;
  uVar5 = (ulong)buf->compat_size;
  uVar3 = buf->size;
  if (buf->size != uVar5 && uVar5 < 0x7fffffff) {
    buf->size = uVar5;
    uVar3 = uVar5;
  }
  uVar6 = (ulong)buf->compat_use;
  uVar5 = buf->use;
  if (buf->use != uVar6 && uVar6 < 0x7fffffff) {
    buf->use = uVar6;
    uVar5 = uVar6;
  }
  xVar1 = buf->alloc;
  if (xVar1 == XML_BUFFER_ALLOC_IMMUTABLE) {
    uVar9 = 0;
  }
  else {
    uVar6 = (ulong)(uint)len;
    if (uVar6 < uVar3 - uVar5) {
      uVar9 = (uVar3 - uVar5) - 1;
    }
    else {
      if (~uVar5 <= uVar6) {
        extra = "growing buffer past SIZE_MAX";
LAB_00136667:
        __xmlSimpleError(0x1d,2,(xmlNodePtr)0x0,(char *)0x0,extra);
        if (buf->error == 0) {
          buf->error = 2;
        }
        goto LAB_0013654a;
      }
      if (uVar6 < uVar3) {
        uVar9 = 0xffffffffffffffff;
        if (-1 < (long)uVar3) {
          uVar9 = uVar3 * 2;
        }
      }
      else {
        uVar9 = 0xffffffffffffffff;
        if (uVar5 + uVar6 < 0xffffffffffffff9c) {
          uVar9 = uVar5 + uVar6 + 100;
        }
      }
      if (xVar1 == XML_BUFFER_ALLOC_IO) {
        pxVar4 = buf->contentIO;
        if (pxVar4 == (xmlChar *)0x0) goto LAB_001365ff;
        lVar8 = (long)buf->content - (long)pxVar4;
        pxVar4 = (xmlChar *)(*xmlRealloc)(pxVar4,lVar8 + uVar9);
        if (pxVar4 == (xmlChar *)0x0) goto LAB_00136657;
        buf->contentIO = pxVar4;
        pxVar4 = pxVar4 + lVar8;
      }
      else {
        if (xVar1 == XML_BUFFER_ALLOC_BOUNDED) {
          if ((9999999 < uVar3) || ((uVar6 + uVar5) - 9999999 < 0xffffffffff676980)) {
            extra = "buffer error: text too long\n";
            goto LAB_00136667;
          }
          if (9999999 < uVar9) {
            uVar9 = 10000000;
          }
        }
LAB_001365ff:
        pxVar4 = (xmlChar *)(*xmlRealloc)(buf->content,uVar9);
        if (pxVar4 == (xmlChar *)0x0) {
LAB_00136657:
          extra = "growing buffer";
          goto LAB_00136667;
        }
      }
      buf->content = pxVar4;
      buf->size = uVar9;
      uVar2 = 0x7fffffff;
      if (uVar9 < 0x7fffffff) {
        uVar2 = (uint)uVar9;
      }
      buf->compat_size = uVar2;
      uVar3 = buf->use;
      uVar5 = 0x7fffffff;
      if (uVar3 < 0x7fffffff) {
        uVar5 = uVar3;
      }
      buf->compat_use = (uint)uVar5;
      if (buf->error != 0) goto LAB_0013654a;
      uVar9 = uVar9 + ~uVar3;
    }
  }
  uVar7 = 0x7fffffff;
  if (uVar9 < 0x7fffffff) {
    uVar7 = uVar9;
  }
LAB_0013654a:
  return (int)uVar7;
}

Assistant:

int
xmlBufGrow(xmlBufPtr buf, int len) {
    size_t ret;

    if ((buf == NULL) || (len < 0)) return(-1);
    if (len == 0)
        return(0);
    ret = xmlBufGrowInternal(buf, len);
    if (buf->error != 0)
        return(-1);
    return(ret > INT_MAX ? INT_MAX : ret);
}